

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Minisat::SimpSolver::addLearnedClause(SimpSolver *this,vec<Minisat::Lit> *cls)

{
  uint64_t *puVar1;
  vec<unsigned_int> *this_00;
  ulong *puVar2;
  double dVar3;
  int iVar4;
  Lit p;
  uint *puVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  CRef CStack_1c;
  
  if (0 < (long)cls->sz) {
    lVar8 = 0;
    do {
      if ((this->eliminated).data[cls->data[lVar8].x >> 1] != '\0') {
        return;
      }
      lVar8 = lVar8 + 1;
    } while (cls->sz != lVar8);
  }
  if ((this->super_Solver).receiveClauses == true) {
    puVar1 = &(this->super_Solver).receivedCls;
    *puVar1 = *puVar1 + 1;
    if (cls->sz == 1) {
      iVar4 = cls->data->x;
      if (((byte)iVar4 & 1 ^ (this->super_Solver).assigns.data[iVar4 >> 1].value) == 1) {
        (this->super_Solver).ok = false;
      }
      else {
        Solver::cancelUntil(&this->super_Solver,0,false);
        p.x = cls->data->x;
        if (((this->super_Solver).assigns.data[p.x >> 1].value & 2) != 0) {
          Solver::uncheckedEnqueue(&this->super_Solver,p,0,0xffffffff);
          return;
        }
      }
    }
    else {
      CStack_1c = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
                            (&(this->super_Solver).ca,cls,true);
      this_00 = &(this->super_Solver).learnts_local;
      vec<unsigned_int>::push(this_00,&CStack_1c);
      Solver::attachClause(&this->super_Solver,CStack_1c);
      puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      puVar2 = (ulong *)(puVar5 + CStack_1c);
      dVar3 = (this->super_Solver).cla_inc;
      fVar9 = (float)((double)*(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) + dVar3);
      *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) = fVar9;
      if (1e+20 < fVar9) {
        lVar8 = (long)(this->super_Solver).learnts_local.sz;
        if (0 < lVar8) {
          puVar6 = this_00->data;
          lVar7 = 0;
          do {
            puVar2 = (ulong *)(puVar5 + puVar6[lVar7]);
            *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) =
                 *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) * 1e-20;
            lVar7 = lVar7 + 1;
          } while (lVar8 != lVar7);
        }
        (this->super_Solver).cla_inc = dVar3 * 1e-20;
      }
    }
  }
  return;
}

Assistant:

void SimpSolver::addLearnedClause(const vec<Lit> &cls)
{
    /* do not receive clauses that contain eliminated variables */
    for (int i = 0; i < cls.size(); ++i)
        if (isEliminated(var(cls[i]))) return;
    Solver::addLearnedClause(cls);
}